

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * apply_check_bigger_operation(Value *left_value,Value *right_value)

{
  ValueType VVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  longlong lVar5;
  longlong lVar6;
  Value *pVVar7;
  bool bVar8;
  bool bVar9;
  longdouble lVar10;
  longdouble lVar11;
  
  VVar1 = left_value->value_type;
  if ((VVar1 == ValueTypeIntegerValue) && (right_value->value_type == ValueTypeIntegerValue)) {
    lVar2 = *(long *)(left_value + 1);
    lVar3 = *(long *)(right_value + 1);
    bVar9 = SBORROW8(lVar2,lVar3);
    lVar4 = lVar2 - lVar3;
    bVar8 = lVar2 == lVar3;
  }
  else {
    if (((VVar1 & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
       ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
      if (VVar1 == ValueTypeFloatValue) {
        lVar10 = *(longdouble *)&left_value[1].linked_variable_count;
      }
      else {
        lVar10 = (longdouble)*(long *)(left_value + 1);
      }
      if (right_value->value_type == ValueTypeFloatValue) {
        lVar11 = *(longdouble *)&right_value[1].linked_variable_count;
      }
      else {
        lVar11 = (longdouble)*(long *)(right_value + 1);
      }
      bVar8 = lVar11 < lVar10;
      goto LAB_001080df;
    }
    lVar5 = convert_to_integer(left_value);
    lVar6 = convert_to_integer(right_value);
    bVar9 = SBORROW8(lVar5,lVar6);
    lVar4 = lVar5 - lVar6;
    bVar8 = lVar5 == lVar6;
  }
  bVar8 = !bVar8 && bVar9 == lVar4 < 0;
LAB_001080df:
  pVVar7 = new_bool_value(bVar8);
  return pVVar7;
}

Assistant:

Value *apply_check_bigger_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value > ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float > right_float);
  }

  return new_bool_value(convert_to_integer(left_value) > convert_to_integer(right_value));
}